

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

char __thiscall anon_unknown.dwarf_a5d2fc::NumericTokenizer::nextToken(NumericTokenizer *this)

{
  QStringView s;
  QStringView s_00;
  QStringView s_01;
  QStringView s_02;
  QStringView s_03;
  QStringView s_04;
  QStringView s_05;
  QStringView s_06;
  bool bVar1;
  uchar uVar2;
  char16_t cVar3;
  uint uVar4;
  int iVar5;
  char32_t cVar6;
  qsizetype qVar7;
  char16_t *pcVar8;
  QStringView *this_00;
  NumericTokenizer *in_RDI;
  long in_FS_OFFSET;
  uint gap_1;
  uint gap;
  char ascii_1;
  uchar ascii;
  size_t RuntimeThreshold_3;
  size_t RuntimeThreshold_2;
  size_t RuntimeThreshold_1;
  size_t RuntimeThreshold;
  size_t i;
  size_t i_1;
  size_t i_2;
  size_t i_3;
  QChar low;
  QChar ch;
  QStringView tail;
  anon_class_1_0_00000001 asciiLower;
  undefined4 in_stack_fffffffffffffd98;
  CaseSensitivity in_stack_fffffffffffffd9c;
  char ch_00;
  NumericTokenizer *in_stack_fffffffffffffda0;
  QStringView *in_stack_fffffffffffffda8;
  char16_t *str;
  QStringView *in_stack_fffffffffffffdb0;
  qsizetype in_stack_fffffffffffffdb8;
  QChar c;
  QStringView *in_stack_fffffffffffffdc0;
  undefined1 *puVar9;
  storage_type_conflict *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  bool bVar10;
  storage_type_conflict *in_stack_fffffffffffffdd8;
  byte local_1e8;
  bool local_1e3;
  bool local_1e2;
  byte local_1b9;
  ulong local_138;
  ulong local_120;
  ulong local_108;
  ulong local_f0;
  ulong local_e0;
  char16_t local_d8 [8];
  undefined1 local_c8 [22];
  QChar local_b2 [17];
  char16_t local_90;
  char16_t local_8e;
  char16_t local_8c;
  char16_t local_8a;
  qsizetype local_88;
  storage_type_conflict *local_80;
  qsizetype local_78;
  storage_type_conflict *local_70;
  qsizetype local_68;
  storage_type_conflict *local_60;
  qsizetype local_58;
  storage_type_conflict *local_50;
  qsizetype local_48;
  storage_type_conflict *local_40;
  qsizetype local_38;
  storage_type_conflict *local_30;
  QChar local_24;
  QChar local_22;
  QStringView local_20;
  anon_class_1_0_00000001 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (anon_class_1_0_00000001)0xaa;
  local_20.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QStringView::sliced(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  c.ucs = (char16_t)((ulong)in_stack_fffffffffffffdb8 >> 0x30);
  local_22.ucs = L'ꪪ';
  local_22 = QStringView::front(&in_stack_fffffffffffffda0->m_text);
  QChar::QChar<char16_t,_true>(&local_24,L'−');
  bVar1 = ::operator==((QChar *)in_stack_fffffffffffffda0,
                       (QChar *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  if (bVar1) {
    in_RDI->m_index = in_RDI->m_index + 1;
    local_1b9 = 0x2d;
    goto LAB_004d8c3f;
  }
  if (((in_RDI->m_guide).isC & 1U) != 0) {
    in_RDI->m_index = in_RDI->m_index + 1;
    cVar3 = QChar::unicode(&local_22);
    ch_00 = (char)(in_stack_fffffffffffffd9c >> 0x18);
    if ((ushort)cVar3 < 0x100) {
      uVar2 = QChar::toLatin1(&local_22);
      uVar4 = nextToken::anon_class_1_0_00000001::operator()(&local_9,uVar2);
      local_1b9 = (byte)uVar4;
      bVar1 = QtMiscUtils::isAsciiDigit(uVar4 & 0xff);
      local_1e2 = true;
      if ((!bVar1) &&
         ((local_1b9 < 0x2b || (local_1e2 = true, (int)in_RDI->lastMark < (int)(uVar4 & 0xff))))) {
        if (in_RDI->m_mode != IntegerMode) {
          bVar1 = isInfNanChar(in_stack_fffffffffffffda0,ch_00);
          local_1e2 = true;
          if (bVar1) goto LAB_004d80a0;
        }
        local_1e2 = in_RDI->m_mode == DoubleScientificMode && local_1b9 == 0x65;
      }
LAB_004d80a0:
      if (local_1e2) goto LAB_004d8c3f;
    }
    local_1b9 = 0;
    goto LAB_004d8c3f;
  }
  cVar3 = QChar::unicode(&local_22);
  if ((ushort)cVar3 < 0x100) {
    uVar2 = QChar::toLatin1(&local_22);
    iVar5 = nextToken::anon_class_1_0_00000001::operator()(&local_9,uVar2);
    local_1b9 = (byte)iVar5;
    bVar1 = QtMiscUtils::isAsciiDigit((int)(char)local_1b9);
    if ((((bVar1) || (local_1b9 == 0x2d)) || (local_1b9 == 0x2b)) ||
       ((in_RDI->m_mode != IntegerMode &&
        (bVar1 = isInfNanChar(in_stack_fffffffffffffda0,(char)(in_stack_fffffffffffffd9c >> 0x18)),
        bVar1)))) {
      in_RDI->m_index = in_RDI->m_index + 1;
      goto LAB_004d8c3f;
    }
  }
  local_38 = (in_RDI->m_guide).minus.m_size;
  local_30 = (in_RDI->m_guide).minus.m_data;
  s.m_data = in_stack_fffffffffffffdc8;
  s.m_size = (qsizetype)in_stack_fffffffffffffdc0;
  bVar1 = QStringView::startsWith
                    ((QStringView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),s,
                     CaseInsensitive);
  if (bVar1) {
    qVar7 = QStringView::size(&(in_RDI->m_guide).minus);
    in_RDI->m_index = qVar7 + in_RDI->m_index;
    local_1b9 = 0x2d;
    goto LAB_004d8c3f;
  }
  local_48 = (in_RDI->m_guide).plus.m_size;
  local_40 = (in_RDI->m_guide).plus.m_data;
  s_00.m_data = in_stack_fffffffffffffdc8;
  s_00.m_size = (qsizetype)in_stack_fffffffffffffdc0;
  bVar1 = QStringView::startsWith
                    ((QStringView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                     s_00,CaseInsensitive);
  if (bVar1) {
    qVar7 = QStringView::size(&(in_RDI->m_guide).plus);
    in_RDI->m_index = qVar7 + in_RDI->m_index;
    local_1b9 = 0x2b;
    goto LAB_004d8c3f;
  }
  bVar1 = QStringView::isEmpty((QStringView *)0x4d82c5);
  if (!bVar1) {
    local_58 = (in_RDI->m_guide).group.m_size;
    local_50 = (in_RDI->m_guide).group.m_data;
    s_01.m_data = in_stack_fffffffffffffdc8;
    s_01.m_size = (qsizetype)in_stack_fffffffffffffdc0;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       s_01,CaseInsensitive);
    if (bVar1) {
      qVar7 = QStringView::size(&(in_RDI->m_guide).group);
      in_RDI->m_index = qVar7 + in_RDI->m_index;
      bVar1 = fractionGroupClash(in_stack_fffffffffffffda0);
      if (bVar1) {
        local_68 = (in_RDI->m_guide).decimal.m_size;
        local_60 = (in_RDI->m_guide).decimal.m_data;
        QStringView::size(&(in_RDI->m_guide).group);
        s_06.m_size._7_1_ = in_stack_fffffffffffffdd7;
        s_06.m_size._0_7_ = in_stack_fffffffffffffdd0;
        s_06.m_data = in_stack_fffffffffffffdd8;
        qVar7 = QStringView::indexOf
                          (in_stack_fffffffffffffda8,s_06,(qsizetype)in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffd9c);
        if (qVar7 == -1) {
          local_1b9 = 0x2e;
          goto LAB_004d8c3f;
        }
      }
      local_1b9 = 0x2c;
      goto LAB_004d8c3f;
    }
  }
  if (in_RDI->m_mode != IntegerMode) {
    local_78 = (in_RDI->m_guide).decimal.m_size;
    local_70 = (in_RDI->m_guide).decimal.m_data;
    s_02.m_data = in_stack_fffffffffffffdc8;
    s_02.m_size = (qsizetype)in_stack_fffffffffffffdc0;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       s_02,CaseInsensitive);
    if (bVar1) {
      qVar7 = QStringView::size(&(in_RDI->m_guide).decimal);
      in_RDI->m_index = qVar7 + in_RDI->m_index;
      local_1b9 = 0x2e;
      goto LAB_004d8c3f;
    }
  }
  if (in_RDI->m_mode == DoubleScientificMode) {
    local_88 = (in_RDI->m_guide).exponent.m_size;
    local_80 = (in_RDI->m_guide).exponent.m_data;
    s_03.m_data = in_stack_fffffffffffffdc8;
    s_03.m_size = (qsizetype)in_stack_fffffffffffffdc0;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       s_03,CaseInsensitive);
    if (bVar1) {
      qVar7 = QStringView::size(&(in_RDI->m_guide).exponent);
      in_RDI->m_index = qVar7 + in_RDI->m_index;
      local_1b9 = 0x65;
      goto LAB_004d8c3f;
    }
  }
  if ((in_RDI->m_guide).zeroLen == '\x01') {
    bVar1 = QChar::isSurrogate((QChar *)0x4d8522);
    if (bVar1) {
      bVar1 = QChar::isHighSurrogate((QChar *)0x4d8596);
      local_1e3 = false;
      if (bVar1) {
        qVar7 = QStringView::size(&local_20);
        local_1e3 = false;
        if (1 < qVar7) {
          local_8a = (char16_t)
                     QStringView::at(in_stack_fffffffffffffda8,(qsizetype)in_stack_fffffffffffffda0)
          ;
          local_1e3 = QChar::isLowSurrogate((QChar *)0x4d85ee);
        }
      }
      if (local_1e3 != false) {
        local_1b9 = 0;
        goto LAB_004d8c3f;
      }
    }
    else {
      cVar3 = QChar::unicode(&local_22);
      uVar4 = asBmpDigit(in_RDI,cVar3);
      if (uVar4 < 10) {
        in_RDI->m_index = in_RDI->m_index + 1;
        local_1b9 = (char)uVar4 + 0x30;
        goto LAB_004d8c3f;
      }
    }
  }
  else {
    bVar1 = QChar::isHighSurrogate((QChar *)0x4d8623);
    if (bVar1) {
      qVar7 = QStringView::size(&local_20);
      if (1 < qVar7) {
        local_8c = 0xaaaa;
        local_8c = (char16_t)
                   QStringView::at(in_stack_fffffffffffffda8,(qsizetype)in_stack_fffffffffffffda0);
        bVar1 = QChar::isLowSurrogate((QChar *)0x4d8679);
        if (bVar1) {
          in_RDI->m_index = in_RDI->m_index + 2;
          local_8e = local_22.ucs;
          local_90 = local_8c;
          cVar6 = QChar::surrogateToUcs4((QChar)0x0,(QChar)0x0);
          uVar4 = cVar6 - (in_RDI->m_guide).zeroUcs;
          if (uVar4 < 10) {
            local_1e8 = (char)uVar4 + 0x30;
          }
          else {
            local_1e8 = 0;
          }
          local_1b9 = local_1e8;
          goto LAB_004d8c3f;
        }
      }
      local_1b9 = 0;
      goto LAB_004d8c3f;
    }
  }
  std::data<char16_t_const,2ul>((char16_t (*) [2])L"\xa0");
  for (local_138 = 0; (local_138 < 2 && (L"\xa0"[local_138] != L'\0')); local_138 = local_138 + 1) {
  }
  QStringView::QStringView<char16_t,_true>
            (in_stack_fffffffffffffdb0,(char16_t *)in_stack_fffffffffffffda8,
             (qsizetype)in_stack_fffffffffffffda0);
  bVar1 = ::operator==(&in_stack_fffffffffffffda0->m_text,
                       (QStringView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
  ;
  if (bVar1) {
LAB_004d8978:
    QChar::QChar<char16_t,_true>(local_b2,L' ');
    bVar10 = QStringView::startsWith(in_stack_fffffffffffffdb0,c);
  }
  else {
    std::data<char16_t_const,2ul>((char16_t (*) [2])L"\x202f");
    for (local_120 = 0; (local_120 < 2 && (L"\x202f"[local_120] != L'\0'));
        local_120 = local_120 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_fffffffffffffdb0,(char16_t *)in_stack_fffffffffffffda8,
               (qsizetype)in_stack_fffffffffffffda0);
    bVar1 = ::operator==(&in_stack_fffffffffffffda0->m_text,
                         (QStringView *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    bVar10 = false;
    if (bVar1) goto LAB_004d8978;
  }
  if (bVar10 != false) {
    in_RDI->m_index = in_RDI->m_index + 1;
    local_1b9 = 0x2c;
    goto LAB_004d8c3f;
  }
  if (((in_RDI->m_guide).exponentCyrillic & 1U) == 0) {
LAB_004d8c37:
    local_1b9 = 0;
  }
  else {
    puVar9 = local_c8;
    pcVar8 = std::data<char16_t_const,2ul>((char16_t (*) [2])L"Е");
    for (local_108 = 0; (local_108 < 2 && (L"Е"[local_108] != L'\0')); local_108 = local_108 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              (in_stack_fffffffffffffdb0,(char16_t *)in_stack_fffffffffffffda8,
               (qsizetype)in_stack_fffffffffffffda0);
    s_04.m_data = pcVar8;
    s_04.m_size = (qsizetype)puVar9;
    bVar1 = QStringView::startsWith
                      ((QStringView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       s_04,CaseInsensitive);
    if (!bVar1) {
      str = local_d8;
      this_00 = (QStringView *)std::data<char16_t_const,2ul>((char16_t (*) [2])L"E");
      for (local_f0 = 0; local_f0 < 2; local_f0 = local_f0 + 1) {
        if (L"E"[local_f0] == L'\0') {
          local_e0 = local_f0;
          goto LAB_004d8bcd;
        }
      }
      local_e0 = 2;
LAB_004d8bcd:
      QStringView::QStringView<char16_t,_true>(this_00,str,local_e0);
      s_05.m_data = pcVar8;
      s_05.m_size = (qsizetype)puVar9;
      bVar1 = QStringView::startsWith
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),s_05,
                         CaseInsensitive);
      if (!bVar1) goto LAB_004d8c37;
    }
    in_RDI->m_index = in_RDI->m_index + 1;
    local_1b9 = 0x65;
  }
LAB_004d8c3f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1b9;
  }
  __stack_chk_fail();
}

Assistant:

char NumericTokenizer::nextToken()
{
    // As long as caller stops iterating on a zero return, those don't need to
    // keep m_index correctly updated.
    Q_ASSERT(!done());
    // Mauls non-letters above 'Z' but we don't care:
    const auto asciiLower = [](unsigned char c) { return c >= 'A' ? c | 0x20 : c; };
    const QStringView tail = m_text.sliced(m_index);
    const QChar ch = tail.front();
    if (ch == u'\u2212') {
        // Special case: match the "proper" minus sign, for all locales.
        ++m_index;
        return '-';
    }
    if (m_guide.isC) {
        // "Conversion" to C locale is just a filter:
        ++m_index;
        if (Q_LIKELY(ch.unicode() < 256)) {
            unsigned char ascii = asciiLower(ch.toLatin1());
            if (Q_LIKELY(isAsciiDigit(ascii) || ('+' <= ascii && ascii <= lastMark)
                         // No caller presently (6.5) passes DoubleStandardMode,
                         // so !IntegerMode implies scientific, for now.
                         || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))
                         || (m_mode == QLocaleData::DoubleScientificMode && ascii == 'e'))) {
                return ascii;
            }
        }
        return 0;
    }
    if (ch.unicode() < 256) {
        // Accept the C locale's digits and signs in all locales:
        char ascii = asciiLower(ch.toLatin1());
        if (isAsciiDigit(ascii) || ascii == '-' || ascii == '+'
            // Also its Inf and NaN letters:
            || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))) {
            ++m_index;
            return ascii;
        }
    }

    // Other locales may be trickier:
    if (tail.startsWith(m_guide.minus)) {
        m_index += m_guide.minus.size();
        return '-';
    }
    if (tail.startsWith(m_guide.plus)) {
        m_index += m_guide.plus.size();
        return '+';
    }
    if (!m_guide.group.isEmpty() && tail.startsWith(m_guide.group)) {
        m_index += m_guide.group.size();
        // When group and decimal coincide, and a fractional part is not
        // unexpected, treat the last as a fractional part separator (and leave
        // the caller to special-case the situations where that causes a
        // parse-fail that we can dodge by not reading it that way).
        if (fractionGroupClash() && tail.indexOf(m_guide.decimal, m_guide.group.size()) == -1)
            return '.';
        return ',';
    }
    if (m_mode != QLocaleData::IntegerMode && tail.startsWith(m_guide.decimal)) {
        m_index += m_guide.decimal.size();
        return '.';
    }
    if (m_mode == QLocaleData::DoubleScientificMode
        && tail.startsWith(m_guide.exponent, Qt::CaseInsensitive)) {
        m_index += m_guide.exponent.size();
        return 'e';
    }

    // Must match qlocale_tools.h's unicodeForDigit()
    if (m_guide.zeroLen == 1) {
        if (!ch.isSurrogate()) {
            const uint gap = asBmpDigit(ch.unicode());
            if (gap < 10u) {
                ++m_index;
                return '0' + gap;
            }
        } else if (ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()) {
            return 0;
        }
    } else if (ch.isHighSurrogate()) {
        // None of the corner cases below matches a surrogate, so (update
        // already and) return early if we don't have a digit.
        if (tail.size() > 1) {
            QChar low = tail.at(1);
            if (low.isLowSurrogate()) {
                m_index += 2;
                const uint gap = QChar::surrogateToUcs4(ch, low) - m_guide.zeroUcs;
                return gap < 10u ? '0' + gap : 0;
            }
        }
        return 0;
    }

    // All cases where tail starts with properly-matched surrogate pair
    // have been handled by this point.
    Q_ASSERT(!(ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()));

    // Weird corner cases follow (code above assumes these match no surrogates).

    // Some locales use a non-breaking space (U+00A0) or its thin version
    // (U+202f) for grouping. These look like spaces, so people (and thus some
    // of our tests) use a regular space instead and complain if it doesn't
    // work.
    // Should this be extended generally to any case where group is a space ?
    if ((m_guide.group == u"\u00a0" || m_guide.group == u"\u202f") && tail.startsWith(u' ')) {
        ++m_index;
        return ',';
    }

    // Cyrillic has its own E, used by Ukrainian as exponent; but others
    // writing Cyrillic may well use that; and Ukrainians might well use E.
    // All other Cyrillic locales (officially) use plain ASCII E.
    if (m_guide.exponentCyrillic // Only true in scientific float mode.
        && (tail.startsWith(u"\u0415", Qt::CaseInsensitive)
            || tail.startsWith(u"E", Qt::CaseInsensitive))) {
        ++m_index;
        return 'e';
    }

    return 0;
}